

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tck-reach.cc
# Opt level: O1

int parse_command_line(int argc,char **argv)

{
  size_type sVar1;
  size_type sVar2;
  char *__s1;
  int iVar3;
  runtime_error *prVar4;
  char *pcVar5;
  string *psVar6;
  int long_option_index;
  allocator<char> local_75;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
LAB_0012e83e:
  while( true ) {
    local_74 = -1;
    iVar3 = getopt_long(argc,argv,"a:C:hl:o:s:",long_options,&local_74);
    __s1 = _optarg;
    sVar2 = output_file_abi_cxx11_._M_string_length;
    sVar1 = labels_abi_cxx11_._M_string_length;
    pcVar5 = (char *)search_order_abi_cxx11_._M_string_length;
    if (iVar3 < 0x68) break;
    if (iVar3 < 0x6f) {
      if (iVar3 != 0x68) {
        if (iVar3 == 0x6c) {
          strlen(_optarg);
          psVar6 = &labels_abi_cxx11_;
          pcVar5 = (char *)sVar1;
          goto LAB_0012e9ec;
        }
        goto LAB_0012eb24;
      }
      help = 1;
    }
    else {
      if (iVar3 == 0x6f) {
        strlen(_optarg);
        psVar6 = &output_file_abi_cxx11_;
        pcVar5 = (char *)sVar2;
      }
      else {
        if (iVar3 != 0x73) goto LAB_0012eb24;
        strlen(_optarg);
        psVar6 = &search_order_abi_cxx11_;
      }
LAB_0012e9ec:
      std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar5,(ulong)__s1);
    }
  }
  if (iVar3 < 0x3f) {
    if (iVar3 == 0) {
      pcVar5 = long_options[local_74].name;
      iVar3 = strcmp(pcVar5,"block-size");
      if (iVar3 == 0) {
        block_size = strtoull(_optarg,(char **)0x0,10);
      }
      else {
        iVar3 = strcmp(pcVar5,"table-size");
        if (iVar3 != 0) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar4,"This also should never be executed");
LAB_0012eb5e:
          __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        table_size = strtoull(_optarg,(char **)0x0,10);
      }
      goto LAB_0012e83e;
    }
    if (iVar3 == -1) {
      return _optind;
    }
    if (iVar3 == 0x3a) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Missing option parameter");
      goto LAB_0012eb5e;
    }
  }
  else {
    if (iVar3 == 0x43) {
      iVar3 = strcmp(_optarg,"none");
      if (iVar3 == 0) {
        certificate = CERTIFICATE_NONE;
      }
      else {
        iVar3 = strcmp(__s1,"graph");
        if (iVar3 == 0) {
          certificate = CERTIFICATE_GRAPH;
        }
        else {
          iVar3 = strcmp(__s1,"concrete");
          if (iVar3 == 0) {
            certificate = CERTIFICATE_CONCRETE;
          }
          else {
            iVar3 = strcmp(__s1,"symbolic");
            if (iVar3 != 0) {
              prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,_optarg,&local_75);
              std::operator+(&local_50,"Unknown type of certificate: ",&local_70);
              std::runtime_error::runtime_error(prVar4,(string *)&local_50);
              __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            certificate = CERTIFICATE_SYMBOLIC;
          }
        }
      }
      goto LAB_0012e83e;
    }
    if (iVar3 == 0x61) {
      iVar3 = strcmp(_optarg,"reach");
      if (iVar3 == 0) {
        algorithm = ALGO_REACH;
      }
      else {
        iVar3 = strcmp(__s1,"concur19");
        if (iVar3 == 0) {
          algorithm = ALGO_CONCUR19;
        }
        else {
          iVar3 = strcmp(__s1,"covreach");
          if (iVar3 != 0) {
            prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_70,_optarg,&local_75);
            std::operator+(&local_50,"Unknown algorithm: ",&local_70);
            std::runtime_error::runtime_error(prVar4,(string *)&local_50);
            __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          algorithm = ALGO_COVREACH;
        }
      }
      goto LAB_0012e83e;
    }
    if (iVar3 == 0x3f) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar4,"Unknown command-line option");
      goto LAB_0012eb5e;
    }
  }
LAB_0012eb24:
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"This should never be executed");
  goto LAB_0012eb5e;
}

Assistant:

int parse_command_line(int argc, char * argv[])
{
  while (true) {
    int long_option_index = -1;
    int c = getopt_long(argc, argv, options, long_options, &long_option_index);

    if (c == -1)
      break;

    if (c == ':')
      throw std::runtime_error("Missing option parameter");
    else if (c == '?')
      throw std::runtime_error("Unknown command-line option");
    else if (c != 0) {
      switch (c) {
      case 'a':
        if (strcmp(optarg, "reach") == 0)
          algorithm = ALGO_REACH;
        else if (strcmp(optarg, "concur19") == 0)
          algorithm = ALGO_CONCUR19;
        else if (strcmp(optarg, "covreach") == 0)
          algorithm = ALGO_COVREACH;
        else
          throw std::runtime_error("Unknown algorithm: " + std::string(optarg));
        break;
      case 'C':
        if (strcmp(optarg, "none") == 0)
          certificate = CERTIFICATE_NONE;
        else if (strcmp(optarg, "graph") == 0)
          certificate = CERTIFICATE_GRAPH;
        else if (strcmp(optarg, "concrete") == 0)
          certificate = CERTIFICATE_CONCRETE;
        else if (strcmp(optarg, "symbolic") == 0)
          certificate = CERTIFICATE_SYMBOLIC;
        else
          throw std::runtime_error("Unknown type of certificate: " + std::string(optarg));
        break;
      case 'o':
        output_file = optarg;
        break;
      case 'h':
        help = true;
        break;
      case 'l':
        labels = optarg;
        break;
      case 's':
        search_order = optarg;
        break;
      default:
        throw std::runtime_error("This should never be executed");
        break;
      }
    }
    else {
      if (strcmp(long_options[long_option_index].name, "block-size") == 0)
        block_size = std::strtoull(optarg, nullptr, 10);
      else if (strcmp(long_options[long_option_index].name, "table-size") == 0)
        table_size = std::strtoull(optarg, nullptr, 10);
      else
        throw std::runtime_error("This also should never be executed");
    }
  }

  return optind;
}